

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PerformImplementation.hpp
# Opt level: O1

void InstructionSet::M68k::Primitive::
     shift<(InstructionSet::M68k::Operation)77,unsigned_char,CPU::MC68000::ProcessorBase>
               (uint32_t source,uchar *destination,Status *status,ProcessorBase *flow_controller)

{
  byte bVar1;
  ulong uVar2;
  uchar uVar3;
  uint uVar4;
  
  uVar4 = source & 0x3f;
  flow_controller->dynamic_instruction_length_ = uVar4 + 1;
  if (uVar4 == 0) {
    status->overflow_flag = 0;
    status->carry_flag = 0;
  }
  else {
    if (uVar4 < 9) {
      uVar2 = (ulong)((uint)*destination << ((byte)uVar4 - 1 & 0x1f) & 0x80);
      status->extend_flag = uVar2;
      status->carry_flag = uVar2;
    }
    else {
      status->carry_flag = 0;
      status->extend_flag = 0;
    }
    status->overflow_flag = 0;
    uVar3 = '\0';
    if (uVar4 < 8) {
      uVar3 = *destination << ((byte)uVar4 & 0x1f);
    }
    *destination = uVar3;
  }
  bVar1 = *destination;
  status->zero_result = (ulong)bVar1;
  status->negative_flag = (ulong)(bVar1 & 0xffffff80);
  return;
}

Assistant:

int shift_count(uint8_t source, FlowController &flow_controller) {
	const int count = source & 63;
	flow_controller.template did_shift<IntT>(count);
	return count;
}